

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

void __thiscall TextFile::bufPut(TextFile *this,void *p,size_t len)

{
  undefined1 *puVar1;
  
  if (this->mode != Write) {
    __assert_fail("mode == Write",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                  ,0x38f,"void TextFile::bufPut(const void *, const size_t)");
  }
  if (0x1000 < len) {
    puVar1 = &(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x10;
    std::ostream::write(puVar1,(long)(this->buf)._M_dataplus._M_p);
    this->bufPos = 0;
    std::ostream::write(puVar1,(long)p);
    return;
  }
  if (0x1000 < this->bufPos + len) {
    std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                         field_0x10,(long)(this->buf)._M_dataplus._M_p);
    this->bufPos = 0;
  }
  memcpy((this->buf)._M_dataplus._M_p + this->bufPos,p,len);
  this->bufPos = this->bufPos + len;
  return;
}

Assistant:

void TextFile::bufPut(const void *p, const size_t len)
{
	assert(mode == Write);

	if (len > TEXTFILE_BUF_MAX_SIZE)
	{
		// Lots of data.  Let's write directly.
		bufDrainWrite();
		stream.write(reinterpret_cast<const char*>(p), len);
	}
	else
	{
		if (bufPos + len > TEXTFILE_BUF_MAX_SIZE)
			bufDrainWrite();

		memcpy(&buf[bufPos], p, len);
		bufPos += len;
	}
}